

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall
QGraphicsScenePrivate::setActivePanelHelper
          (QGraphicsScenePrivate *this,QGraphicsItem *item,bool duringActivationEvent)

{
  QGraphicsScene *this_00;
  long *plVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  GraphicsItemFlags GVar6;
  FocusPolicy FVar7;
  QGraphicsScene *pQVar8;
  QGraphicsItem *pQVar9;
  QGraphicsItem *pQVar10;
  QGraphicsItem *pQVar11;
  QGraphicsItem *pQVar12;
  QGraphicsScenePrivate *d;
  long lVar13;
  QGraphicsWidget *this_01;
  long in_FS_OFFSET;
  QGraphicsItem *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  char local_64 [4];
  QGraphicsItem *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsScene **)&this->field_0x8;
  if (item == (QGraphicsItem *)0x0) {
    QGraphicsScene::setFocus(this_00,ActiveWindowFocusReason);
    pQVar9 = (QGraphicsItem *)0x0;
  }
  else {
    pQVar8 = (QGraphicsScene *)QGraphicsItem::scene(item);
    if (pQVar8 != this_00) {
      local_58._0_4_ = 2;
      local_58._4_4_ = 0;
      uStack_50._0_4_ = 0;
      uStack_50._4_4_ = 0;
      local_48._0_4_ = 0;
      local_48._4_4_ = 0;
      local_40 = "default";
      QMessageLogger::warning
                ((char *)&local_58,
                 "QGraphicsScene::setActivePanel: item %p must be part of this scene",item);
      goto LAB_00600cbc;
    }
    QGraphicsScene::setFocus(this_00,ActiveWindowFocusReason);
    pQVar9 = QGraphicsItem::panel(item);
  }
  pQVar11 = this->activePanel;
  pQVar10 = pQVar11;
  if (pQVar9 == (QGraphicsItem *)0x0) {
    pQVar10 = (QGraphicsItem *)0x0;
  }
  this->lastActivePanel = pQVar10;
  uStack_50 = (QGraphicsItem **)CONCAT44(uStack_50._4_4_,(undefined4)uStack_50);
  local_48 = (QGraphicsItem **)CONCAT44(local_48._4_4_,(undefined4)local_48);
  if ((pQVar9 != pQVar11) &&
     (uStack_50 = (QGraphicsItem **)CONCAT44(uStack_50._4_4_,(undefined4)uStack_50),
     local_48 = (QGraphicsItem **)CONCAT44(local_48._4_4_,(undefined4)local_48),
     0 < *(int *)(*(long *)(this_00 + 8) + 0x1b8) || duringActivationEvent)) {
    pQVar10 = this->focusItem;
    if (pQVar11 == (QGraphicsItem *)0x0) {
      if (pQVar9 != (QGraphicsItem *)0x0 && !duringActivationEvent) {
        local_48._0_4_ = 0xaaaaaaaa;
        local_48._4_4_ = 0xaaaaaaaa;
        local_58._0_4_ = 0xaaaaaaaa;
        local_58._4_4_ = 0xaaaaaaaa;
        uStack_50._0_4_ = 0xaaaaaaaa;
        uStack_50._4_4_ = 0xaaaaaaaa;
        plVar1 = *(long **)(*(long *)(this_00 + 8) + 0x88);
        (**(code **)(*plVar1 + 0x60))(&local_58,plVar1,1);
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
        QEvent::QEvent((QEvent *)&local_78,WindowDeactivate);
        lVar4 = CONCAT44(local_48._4_4_,(undefined4)local_48);
        if (lVar4 != 0) {
          lVar3 = CONCAT44(uStack_50._4_4_,(undefined4)uStack_50);
          lVar13 = 0;
          do {
            pQVar11 = *(QGraphicsItem **)(lVar3 + lVar13);
            bVar5 = QGraphicsItem::isVisible(pQVar11);
            if (((bVar5) && (bVar5 = QGraphicsItem::isPanel(pQVar11), !bVar5)) &&
               (pQVar12 = QGraphicsItem::parentItem(pQVar11), pQVar12 == (QGraphicsItem *)0x0)) {
              QGraphicsScene::sendEvent(this_00,pQVar11,(QEvent *)&local_78);
            }
            lVar13 = lVar13 + 8;
          } while (lVar4 << 3 != lVar13);
        }
        QEvent::~QEvent((QEvent *)&local_78);
        piVar2 = (int *)CONCAT44(local_58._4_4_,(undefined4)local_58);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT44(local_58._4_4_,(undefined4)local_58),8,0x10);
          }
        }
      }
    }
    else {
      pQVar11 = QGraphicsItem::focusItem(pQVar11);
      if ((pQVar11 != (QGraphicsItem *)0x0) &&
         (pQVar11 ==
          *(QGraphicsItem **)
           (*(long *)(this_00 + 8) + 0x188 +
           (ulong)(*(int *)(*(long *)(this_00 + 8) + 0x1b8) < 1) * 0x10))) {
        setFocusItemHelper(this,(QGraphicsItem *)0x0,ActiveWindowFocusReason,false);
      }
      local_58._0_4_ = 0xaaaaaaaa;
      local_58._4_4_ = 0xaaaaaaaa;
      uStack_50._0_4_ = 0xaaaaaaaa;
      uStack_50._4_4_ = 0xaaaaaaaa;
      QEvent::QEvent((QEvent *)&local_58,WindowDeactivate);
      QGraphicsScene::sendEvent(this_00,this->activePanel,(QEvent *)&local_58);
      QEvent::~QEvent((QEvent *)&local_58);
    }
    this->activePanel = pQVar9;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_78,ActivationChange);
    QCoreApplication::sendEvent((QObject *)this_00,(QEvent *)&local_78);
    if (pQVar9 == (QGraphicsItem *)0x0) {
      if (0 < *(int *)(*(long *)(this_00 + 8) + 0x1b8)) {
        local_48._0_4_ = 0xaaaaaaaa;
        local_48._4_4_ = 0xaaaaaaaa;
        local_58._0_4_ = 0xaaaaaaaa;
        local_58._4_4_ = 0xaaaaaaaa;
        uStack_50._0_4_ = 0xaaaaaaaa;
        uStack_50._4_4_ = 0xaaaaaaaa;
        plVar1 = *(long **)(*(long *)(this_00 + 8) + 0x88);
        (**(code **)(*plVar1 + 0x60))(&local_58,plVar1,1);
        local_88 = (QGraphicsItem *)&DAT_aaaaaaaaaaaaaaaa;
        puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
        QEvent::QEvent((QEvent *)&local_88,WindowActivate);
        lVar4 = CONCAT44(local_48._4_4_,(undefined4)local_48);
        if (lVar4 != 0) {
          lVar3 = CONCAT44(uStack_50._4_4_,(undefined4)uStack_50);
          lVar13 = 0;
          do {
            pQVar9 = *(QGraphicsItem **)(lVar3 + lVar13);
            bVar5 = QGraphicsItem::isVisible(pQVar9);
            if (((bVar5) && (bVar5 = QGraphicsItem::isPanel(pQVar9), !bVar5)) &&
               (pQVar11 = QGraphicsItem::parentItem(pQVar9), pQVar11 == (QGraphicsItem *)0x0)) {
              QGraphicsScene::sendEvent(this_00,pQVar9,(QEvent *)&local_88);
            }
            lVar13 = lVar13 + 8;
          } while (lVar4 << 3 != lVar13);
        }
        QEvent::~QEvent((QEvent *)&local_88);
        piVar2 = (int *)CONCAT44(local_58._4_4_,(undefined4)local_58);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT44(local_58._4_4_,(undefined4)local_58),8,0x10);
          }
        }
      }
    }
    else {
      local_58._0_4_ = 0xaaaaaaaa;
      local_58._4_4_ = 0xaaaaaaaa;
      uStack_50._0_4_ = 0xaaaaaaaa;
      uStack_50._4_4_ = 0xaaaaaaaa;
      QEvent::QEvent((QEvent *)&local_58,WindowActivate);
      QGraphicsScene::sendEvent(this_00,pQVar9,(QEvent *)&local_58);
      pQVar11 = QGraphicsItem::focusItem(pQVar9);
      if ((pQVar11 == (QGraphicsItem *)0x0) &&
         (GVar6 = QGraphicsItem::flags(pQVar9), pQVar11 = pQVar9,
         ((uint)GVar6.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
                super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i & 4) == 0)) {
        bVar5 = QGraphicsItem::isWidget(pQVar9);
        if (bVar5) {
          this_01 = (QGraphicsWidget *)(pQVar9->d_ptr).d[1].needsRepaint.yp;
          do {
            FVar7 = QGraphicsWidget::focusPolicy(this_01);
            if ((FVar7 & TabFocus) != NoFocus) {
              pQVar11 = (QGraphicsItem *)(this_01 + 0x10);
              goto LAB_00600c48;
            }
            this_01 = *(QGraphicsWidget **)(*(long *)(this_01 + 0x18) + 0x1c0);
            pQVar11 = (QGraphicsItem *)(this_01 + 0x10);
            if (this_01 == (QGraphicsWidget *)0x0) {
              pQVar11 = (QGraphicsItem *)0x0;
            }
          } while (pQVar11 != pQVar9);
        }
      }
      else {
LAB_00600c48:
        setFocusItemHelper(this,pQVar11,ActiveWindowFocusReason,false);
      }
      QEvent::~QEvent((QEvent *)&local_58);
    }
    local_88 = this->focusItem;
    uStack_50 = &local_88;
    local_48 = &local_60;
    local_40 = local_64;
    local_64[0] = '\x03';
    local_64[1] = '\0';
    local_64[2] = '\0';
    local_64[3] = '\0';
    local_58._0_4_ = 0;
    local_58._4_4_ = 0;
    local_60 = pQVar10;
    QMetaObject::activate((QObject *)this_00,&QGraphicsScene::staticMetaObject,3,(void **)&local_58)
    ;
    QEvent::~QEvent((QEvent *)&local_78);
  }
LAB_00600cbc:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::setActivePanelHelper(QGraphicsItem *item, bool duringActivationEvent)
{
    Q_Q(QGraphicsScene);
    if (item && item->scene() != q) {
        qWarning("QGraphicsScene::setActivePanel: item %p must be part of this scene",
                 item);
        return;
    }

    // Ensure the scene has focus when we change panel activation.
    q->setFocus(Qt::ActiveWindowFocusReason);

    // Find the item's panel.
    QGraphicsItem *panel = item ? item->panel() : nullptr;
    lastActivePanel = panel ? activePanel : nullptr;
    if (panel == activePanel || (!q->isActive() && !duringActivationEvent))
        return;

    QGraphicsItem *oldFocusItem = focusItem;

    // Deactivate the last active panel.
    if (activePanel) {
        if (QGraphicsItem *fi = activePanel->focusItem()) {
            // Remove focus from the current focus item.
            if (fi == q->focusItem())
                setFocusItemHelper(nullptr, Qt::ActiveWindowFocusReason, /* emitFocusChanged = */ false);
        }

        QEvent event(QEvent::WindowDeactivate);
        q->sendEvent(activePanel, &event);
    } else if (panel && !duringActivationEvent) {
        // Deactivate the scene if changing activation to a panel.
        const auto items = q->items();
        QEvent event(QEvent::WindowDeactivate);
        for (QGraphicsItem *item : items) {
            if (item->isVisible() && !item->isPanel() && !item->parentItem())
                q->sendEvent(item, &event);
        }
    }

    // Update activate state.
    activePanel = panel;
    QEvent event(QEvent::ActivationChange);
    QCoreApplication::sendEvent(q, &event);

    // Activate
    if (panel) {
        QEvent event(QEvent::WindowActivate);
        q->sendEvent(panel, &event);

        // Set focus on the panel's focus item, or itself if it's
        // focusable, or on the first focusable item in the panel's
        // focus chain as a last resort.
        if (QGraphicsItem *focusItem = panel->focusItem()) {
            setFocusItemHelper(focusItem, Qt::ActiveWindowFocusReason, /* emitFocusChanged = */ false);
        } else if (panel->flags() & QGraphicsItem::ItemIsFocusable) {
            setFocusItemHelper(panel, Qt::ActiveWindowFocusReason, /* emitFocusChanged = */ false);
        } else if (panel->isWidget()) {
            QGraphicsWidget *fw = static_cast<QGraphicsWidget *>(panel)->d_func()->focusNext;
            do {
                if (fw->focusPolicy() & Qt::TabFocus) {
                    setFocusItemHelper(fw, Qt::ActiveWindowFocusReason, /* emitFocusChanged = */ false);
                    break;
                }
                fw = fw->d_func()->focusNext;
            } while (fw != panel);
        }
    } else if (q->isActive()) {
        const auto items = q->items();
        // Activate the scene
        QEvent event(QEvent::WindowActivate);
        for (QGraphicsItem *item : items) {
            if (item->isVisible() && !item->isPanel() && !item->parentItem())
                q->sendEvent(item, &event);
        }
    }

    emit q->focusItemChanged(focusItem, oldFocusItem, Qt::ActiveWindowFocusReason);
}